

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::ParseStateTransitionTag(Parser *this,TiXmlHandle *handle)

{
  pointer *pppCVar1;
  iterator iVar2;
  pointer pNVar3;
  pointer pbVar4;
  long lVar5;
  CPT *pCVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  TiXmlNode *this_00;
  TiXmlElement *e_CondProb;
  TiXmlHandle TVar9;
  char *__end;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  CPT *transition;
  CPT *noisy_variant;
  TiXmlHandle local_90;
  vector<despot::CPT*,std::allocator<despot::CPT*>> *local_88;
  vector<despot::CPT*,std::allocator<despot::CPT*>> *local_80;
  TiXmlHandle local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_78,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_90,(char *)&local_78);
  if (local_90.node != (TiXmlNode *)0x0) {
    iVar7 = (*((Function *)&(local_90.node)->super_TiXmlBase)->_vptr_Function[0xb])();
    if (CONCAT44(extraout_var,iVar7) != 0) {
      iVar7 = (*((Function *)&(local_90.node)->super_TiXmlBase)->_vptr_Function[0xb])();
      this_00 = (TiXmlNode *)CONCAT44(extraout_var_00,iVar7);
      goto LAB_0014de0a;
    }
  }
  this_00 = (TiXmlNode *)0x0;
LAB_0014de0a:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Cannot find StateTransitionFunction tag","");
  Ensure(this,this_00 != (TiXmlNode *)0x0,&local_50,(TiXmlBase *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  e_CondProb = util::tinyxml::TiXmlNode::FirstChildElement(this_00);
  if (e_CondProb != (TiXmlElement *)0x0) {
    local_88 = (vector<despot::CPT*,std::allocator<despot::CPT*>> *)&this->transition_funcs_;
    local_80 = (vector<despot::CPT*,std::allocator<despot::CPT*>> *)&this->noisy_transition_funcs_;
    do {
      local_90.node = (TiXmlNode *)CreateStateTransition(this,e_CondProb);
      (*((Function *)&(local_90.node)->super_TiXmlBase)->_vptr_Function[0xf])(local_90.node);
      iVar2._M_current =
           (this->transition_funcs_).
           super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->transition_funcs_).
          super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::CPT*,std::allocator<despot::CPT*>>::
        _M_realloc_insert<despot::CPT*const&>(local_88,iVar2,(CPT **)&local_90);
      }
      else {
        *iVar2._M_current = (CPT *)local_90.node;
        pppCVar1 = &(this->transition_funcs_).
                    super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      if ((DAT_00193e28 != 0.0) || (TVar9.node = local_90.node, NAN(DAT_00193e28))) {
        iVar7 = (*((Function *)&(local_90.node)->super_TiXmlBase)->_vptr_Function[0x11])
                          (local_90.node);
        TVar9.node = (TiXmlNode *)CONCAT44(extraout_var_01,iVar7);
      }
      iVar2._M_current =
           (this->noisy_transition_funcs_).
           super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_78.node = TVar9.node;
      if (iVar2._M_current ==
          (this->noisy_transition_funcs_).
          super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::CPT*,std::allocator<despot::CPT*>>::
        _M_realloc_insert<despot::CPT*const&>(local_80,iVar2,(CPT **)&local_78);
      }
      else {
        *iVar2._M_current = (CPT *)TVar9.node;
        pppCVar1 = &(this->noisy_transition_funcs_).
                    super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      iVar7 = (*((Function *)&(local_90.node)->super_TiXmlBase)->_vptr_Function[0xc])();
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "In <StateTransitionFunction>: Probability distribution does not sum to one!","");
      Ensure(this,SUB41(iVar7,0),&local_70,(TiXmlBase *)e_CondProb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      e_CondProb = util::tinyxml::TiXmlNode::NextSiblingElement(&e_CondProb->super_TiXmlNode);
    } while (e_CondProb != (TiXmlElement *)0x0);
  }
  pNVar3 = (this->action_vars_).
           super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = (vector<despot::CPT*,std::allocator<despot::CPT*>> *)
             ((ulong)((long)(this->transition_funcs_).
                            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->transition_funcs_).
                           super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pbVar4 = (pNVar3->super_Variable).values_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = *(long *)&(pNVar3->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  local_80 = (vector<despot::CPT*,std::allocator<despot::CPT*>> *)&this->is_identity_;
  iVar7 = (int)local_88;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)local_80,(long)iVar7);
  if (0 < iVar7) {
    uVar10 = (ulong)((long)pbVar4 - lVar5) >> 5;
    iVar7 = (int)uVar10;
    local_88 = (vector<despot::CPT*,std::allocator<despot::CPT*>> *)((ulong)local_88 & 0x7fffffff);
    uVar14 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::resize
                ((((_Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)&local_80->field_0x0)->_M_impl).super__Vector_impl_data._M_start + uVar14,
                 (long)iVar7,false);
      if (0 < iVar7) {
        uVar13 = 0;
        do {
          pCVar6 = (this->transition_funcs_).
                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
          iVar8 = (*(pCVar6->super_Function)._vptr_Function[0x10])
                            (pCVar6,(this->action_vars_).
                                    super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                    ._M_impl.super__Vector_impl_data._M_start,uVar13 & 0xffffffff);
          lVar5 = *(long *)&(this->is_identity_).
                            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data;
          uVar11 = uVar13 >> 6;
          uVar12 = 1L << ((byte)uVar13 & 0x3f);
          if ((char)iVar8 == '\0') {
            uVar12 = ~uVar12 & *(ulong *)(lVar5 + uVar11 * 8);
          }
          else {
            uVar12 = uVar12 | *(ulong *)(lVar5 + uVar11 * 8);
          }
          *(ulong *)(lVar5 + uVar11 * 8) = uVar12;
          uVar13 = uVar13 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar13);
      }
      uVar14 = uVar14 + 1;
    } while ((vector<despot::CPT*,std::allocator<despot::CPT*>> *)uVar14 != local_88);
  }
  return;
}

Assistant:

void Parser::ParseStateTransitionTag(TiXmlHandle& handle) {
	TiXmlElement* e_StateTransition = handle.FirstChild("pomdpx").FirstChild(
		"StateTransitionFunction").ToElement();

	Ensure(e_StateTransition != NULL,
		"Cannot find StateTransitionFunction tag");

	TiXmlElement* e_CondProb = e_StateTransition->FirstChildElement();
	while (e_CondProb != 0) {
		CPT* transition = CreateStateTransition(e_CondProb);
		transition->ComputeSparseChildDistribution();
		transition_funcs_.push_back(transition);

		CPT* noisy_variant =
			Globals::config.noise ?
				transition->CreateNoisyVariant(Globals::config.noise) :
				transition;
		noisy_transition_funcs_.push_back(noisy_variant);

		Ensure(transition->Validate(),
			"In <StateTransitionFunction>: Probability distribution does not sum to one!",
			e_CondProb);

		e_CondProb = e_CondProb->NextSiblingElement();
	}

	// TODO: Check whether each state variable corresponds to one CondProb

	int num_states = transition_funcs_.size(), num_actions =
		action_vars_[0].Size();
	is_identity_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		is_identity_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			is_identity_[s][a] =
				transition_funcs_[s]->IsIdentityUnderConstraint(
					&action_vars_[0], a);
		}
	}
}